

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O3

string * Disassembler::jType(string *__return_storage_ptr__,string *bin)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  long *plVar4;
  pointer ppVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  size_type *psVar9;
  int line;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint __len;
  uint uVar13;
  uint uVar14;
  string __str;
  string label;
  string op;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)bin);
  AsmFuncts::getOpCode(&local_b0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar13 = -labelCount;
  if (0 < labelCount) {
    uVar13 = labelCount;
  }
  __len = 1;
  if (9 < uVar13) {
    uVar10 = (ulong)uVar13;
    uVar14 = 4;
    do {
      __len = uVar14;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00127a01;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00127a01;
      }
      if (uVar7 < 10000) goto LAB_00127a01;
      uVar10 = uVar10 / 10000;
      uVar14 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00127a01:
  uVar14 = (uint)labelCount >> 0x1f;
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,(char)__len - (char)(labelCount >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar14 + (long)local_110),__len,uVar13);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x12b0f9);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_e0 = *plVar8;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar8;
    local_f0 = (long *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)bin);
  iVar3 = Conversion::binToDec(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  uVar13 = iVar3 * 4 + -0x400000 >> 2;
  if ((long)labels_abi_cxx11_.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)labels_abi_cxx11_.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
LAB_00127bec:
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_f0,local_e8 + (long)local_f0);
    addLabel(uVar13,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_110 = local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    std::__cxx11::string::append((char *)&local_110);
    plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar9) {
      lVar1 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    goto LAB_00127d17;
  }
  uVar10 = ((long)labels_abi_cxx11_.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)labels_abi_cxx11_.
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if ((labels_abi_cxx11_.
       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->first != uVar13 + 2) {
    uVar2 = 1;
    ppVar5 = labels_abi_cxx11_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar12 = uVar2;
      ppVar5 = ppVar5 + 1;
      if (uVar10 + (uVar10 == 0) == uVar12) break;
      uVar2 = uVar12 + 1;
    } while (ppVar5->first != uVar13 + 2);
    if (uVar10 < uVar12 || uVar10 - uVar12 == 0) goto LAB_00127bec;
  }
  local_110 = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)&local_110);
  getLabel_abi_cxx11_(&local_d0,(Disassembler *)(ulong)uVar13,line);
  uVar10 = 0xf;
  if (local_110 != local_100) {
    uVar10 = local_100[0];
  }
  if (uVar10 < local_d0._M_string_length + local_108) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar11 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_d0._M_string_length + local_108) goto LAB_00127bdd;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00127bdd:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_d0._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar9) {
    uVar11 = puVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar11;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
LAB_00127d17:
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::jType(string bin){
    string op = AsmFuncts::getOpCode(bin.substr(0,6));
    string label = "LABEL_"+to_string(labelCount);
    int addr = Conversion::binToDec(bin.substr(6,26));
    addr <<= 2;
    int line = (addr-BASE)/4;
    if(!labelExists(line)){
      addLabel(line,label);
      return (op+" "+label);
    }
    else
      return (op+" "+getLabel(line));
}